

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbolsToAdopt,
          UNumberFormatStyle style,UErrorCode *status)

{
  UBool UVar1;
  CurrencyPluralInfo *pCVar2;
  DecimalFormatSymbols *this_00;
  DecimalFormatProperties *pDVar3;
  CurrencyPluralInfo *local_150;
  Locale local_138;
  undefined1 local_51;
  CurrencyPluralInfo *local_50;
  LocalPointerBase<icu_63::CurrencyPluralInfo> local_48;
  LocalPointer<icu_63::CurrencyPluralInfo> cpi;
  UErrorCode *status_local;
  UNumberFormatStyle style_local;
  DecimalFormatSymbols *symbolsToAdopt_local;
  UnicodeString *pattern_local;
  DecimalFormat *this_local;
  
  DecimalFormat(this,symbolsToAdopt,status);
  if ((((style == UNUM_CURRENCY) || (style == UNUM_CURRENCY_ISO)) ||
      (style == UNUM_CURRENCY_ACCOUNTING)) ||
     (((style == UNUM_CASH_CURRENCY || (style == UNUM_CURRENCY_STANDARD)) ||
      (style == UNUM_CURRENCY_PLURAL)))) {
    setPropertiesFromPattern(this,pattern,2,status);
  }
  else {
    setPropertiesFromPattern(this,pattern,1,status);
  }
  if (style == UNUM_CURRENCY_PLURAL) {
    pCVar2 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)pattern);
    local_150 = (CurrencyPluralInfo *)0x0;
    if (pCVar2 != (CurrencyPluralInfo *)0x0) {
      local_51 = 1;
      local_50 = pCVar2;
      this_00 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator->
                          (&(this->fields->symbols).
                            super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
      DecimalFormatSymbols::getLocale(&local_138,this_00);
      CurrencyPluralInfo::CurrencyPluralInfo(pCVar2,&local_138,status);
      local_150 = pCVar2;
    }
    local_51 = 0;
    LocalPointer<icu_63::CurrencyPluralInfo>::LocalPointer
              ((LocalPointer<icu_63::CurrencyPluralInfo> *)&local_48,local_150,status);
    if (pCVar2 != (CurrencyPluralInfo *)0x0) {
      Locale::~Locale(&local_138);
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      pCVar2 = LocalPointerBase<icu_63::CurrencyPluralInfo>::orphan(&local_48);
      LocalPointer<icu_63::CurrencyPluralInfo>::adoptInstead
                (&(pDVar3->currencyPluralInfo).fPtr,pCVar2);
    }
    LocalPointer<icu_63::CurrencyPluralInfo>::~LocalPointer
              ((LocalPointer<icu_63::CurrencyPluralInfo> *)&local_48);
    if (UVar1 != '\0') {
      return;
    }
  }
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, DecimalFormatSymbols* symbolsToAdopt,
                             UNumberFormatStyle style, UErrorCode& status)
        : DecimalFormat(symbolsToAdopt, status) {
    // If choice is a currency type, ignore the rounding information.
    if (style == UNumberFormatStyle::UNUM_CURRENCY || style == UNumberFormatStyle::UNUM_CURRENCY_ISO ||
        style == UNumberFormatStyle::UNUM_CURRENCY_ACCOUNTING ||
        style == UNumberFormatStyle::UNUM_CASH_CURRENCY ||
        style == UNumberFormatStyle::UNUM_CURRENCY_STANDARD ||
        style == UNumberFormatStyle::UNUM_CURRENCY_PLURAL) {
        setPropertiesFromPattern(pattern, IGNORE_ROUNDING_ALWAYS, status);
    } else {
        setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    }
    // Note: in Java, CurrencyPluralInfo is set in NumberFormat.java, but in C++, it is not set there,
    // so we have to set it here.
    if (style == UNumberFormatStyle::UNUM_CURRENCY_PLURAL) {
        LocalPointer<CurrencyPluralInfo> cpi(
                new CurrencyPluralInfo(fields->symbols->getLocale(), status),
                status);
        if (U_FAILURE(status)) { return; }
        fields->properties->currencyPluralInfo.fPtr.adoptInstead(cpi.orphan());
    }
    touch(status);
}